

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

bool __thiscall FM::OPNABase::Init(OPNABase *this,uint param_1,uint param_2,bool param_3)

{
  bool param_3_local;
  uint param_2_local;
  uint param_1_local;
  OPNABase *this_local;
  
  OPNBase::RebuildTimeTable(&this->super_OPNBase);
  (*(this->super_OPNBase).super_Timer._vptr_Timer[3])();
  OPNBase::SetVolumeFM(&this->super_OPNBase,0);
  OPNBase::SetVolumePSG(&this->super_OPNBase,0);
  SetChannelMask(this,0);
  return true;
}

Assistant:

bool OPNABase::Init(uint, uint, bool)
{
	RebuildTimeTable();

	Reset();

	SetVolumeFM(0);
	SetVolumePSG(0);
	SetChannelMask(0);
	return true;
}